

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall ConfigTest_write_Test::~ConfigTest_write_Test(ConfigTest_write_Test *this)

{
  ConfigTest_write_Test *this_local;
  
  ~ConfigTest_write_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ConfigTest, write) {
	config l_config;
	std::filesystem::path file_path = make_tmp_file("write.test", "");

	l_config.set_data(u8"some_data");
	l_config.write(file_path);

	l_config.reload();
	EXPECT_EQ(l_config.data().get<std::u8string>(), u8"some_data");
}